

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::ActiveTipChange
          (PeerManagerImpl *this,CBlockIndex *new_tip,bool is_ibd)

{
  CRollingBloomFilter *pCVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock39;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,is_ibd) == 0) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_20,&this->m_tx_download_mutex,
               "m_tx_download_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0x84d,false);
    pCVar1 = RecentRejectsFilter(this);
    CRollingBloomFilter::reset(pCVar1);
    pCVar1 = RecentRejectsReconsiderableFilter(this);
    CRollingBloomFilter::reset(pCVar1);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    // Ensure mempool mutex was released, otherwise deadlock may occur if another thread holding
    // m_tx_download_mutex waits on the mempool mutex.
    AssertLockNotHeld(m_mempool.cs);
    AssertLockNotHeld(m_tx_download_mutex);

    if (!is_ibd) {
        LOCK(m_tx_download_mutex);
        // If the chain tip has changed, previously rejected transactions might now be valid, e.g. due
        // to a timelock. Reset the rejection filters to give those transactions another chance if we
        // see them again.
        RecentRejectsFilter().reset();
        RecentRejectsReconsiderableFilter().reset();
    }
}